

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rq_syst_inv.c
# Opt level: O3

int main(int argc,char **argv)

{
  _Bool _Var1;
  int iVar2;
  int K_upper;
  int K_lower;
  int extraout_EAX;
  
  K_upper = 300;
  K_lower = 1;
  do {
    while( true ) {
      iVar2 = getopt(argc,argv,"hl:u:i:z:s:");
      if (iVar2 < 0x6c) break;
      if (iVar2 == 0x6c) {
        K_lower = atoi(_optarg);
      }
      else if (iVar2 == 0x75) {
        K_upper = atoi(_optarg);
      }
    }
    if (iVar2 == -1) {
      _Var1 = test_syst_inv(K_lower,K_upper);
      return (int)!_Var1;
    }
    if (iVar2 == 0x3f) {
      exit(1);
    }
  } while (iVar2 != 0x68);
  usage();
  return extraout_EAX;
}

Assistant:

int main(int argc, char** argv)
{
	int K_lower = 1;
	int K_upper = 300;

	/* scan command lines */
	int c;
	while ((c = getopt(argc, argv, "hl:u:i:z:s:")) != -1) {
		switch (c) {
		case 'h':
			usage();
			exit(EXIT_SUCCESS);
		case 'l':
			K_lower = atoi(optarg);
			break;
		case 'u':
			K_upper = atoi(optarg);
			break;
		case '?':
			exit(EXIT_FAILURE);
		};
	}

	/* Run tests */
	if (!test_syst_inv(K_lower, K_upper))
		return 1;

	return EXIT_SUCCESS;
}